

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O1

bool __thiscall
cmUuid::StringToBinaryImpl
          (cmUuid *this,string *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *output)

{
  char cVar1;
  pointer pcVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  byte local_29;
  
  if ((input->_M_string_length & 1) == 0) {
    bVar6 = input->_M_string_length == 0;
    if (!bVar6) {
      uVar4 = 0;
      do {
        pcVar2 = (input->_M_dataplus)._M_p;
        cVar1 = pcVar2[uVar4];
        bVar3 = cVar1 - 0x30;
        bVar5 = true;
        if (9 < bVar3) {
          if ((byte)(cVar1 + 0x9fU) < 6) {
            bVar3 = cVar1 + 0xa9;
          }
          else {
            bVar3 = cVar1 - 0x37;
            bVar5 = (byte)(cVar1 + 0xbfU) < 6;
            if (!bVar5) {
              bVar3 = 0;
            }
          }
        }
        if (!bVar5) {
          return bVar6;
        }
        cVar1 = pcVar2[uVar4 + 1];
        local_29 = cVar1 - 0x30;
        bVar5 = true;
        if (9 < local_29) {
          if ((byte)(cVar1 + 0x9fU) < 6) {
            local_29 = cVar1 + 0xa9;
          }
          else {
            local_29 = cVar1 - 0x37;
            bVar5 = (byte)(cVar1 + 0xbfU) < 6;
            if (!bVar5) {
              local_29 = 0;
            }
          }
        }
        if (!bVar5) {
          return bVar6;
        }
        local_29 = local_29 | bVar3 << 4;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (output,&local_29);
        uVar4 = uVar4 + 2;
        bVar5 = uVar4 < input->_M_string_length;
        bVar6 = !bVar5;
      } while (bVar5);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool cmUuid::StringToBinaryImpl(std::string const& input,
                                std::vector<unsigned char>& output) const
{
  if (input.size() % 2) {
    return false;
  }

  for (size_t i = 0; i < input.size(); i += 2) {
    char c1 = 0;
    if (!IntFromHexDigit(input[i], c1)) {
      return false;
    }

    char c2 = 0;
    if (!IntFromHexDigit(input[i + 1], c2)) {
      return false;
    }

    output.push_back(char(c1 << 4 | c2));
  }

  return true;
}